

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::OP_SetNativeIntElementI
               (Var instance,Var aElementIndex,int32 iValue,ScriptContext *scriptContext,
               PropertyOperationFlags flags)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptArray *this;
  uint32 indexInt;
  
  lVar1 = *instance;
  if (((ulong)aElementIndex & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aElementIndex & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aElementIndex & 0xffff000000000000) == 0x1000000000000) goto LAB_00ab0587;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00ab0662;
    *puVar5 = 0;
LAB_00ab0587:
    if (((ulong)aElementIndex & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) {
LAB_00ab0662:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    indexInt = (uint32)aElementIndex;
    if (-1 < (int)indexInt) {
      bVar3 = ScriptContextOptimizationOverrideInfo::IsEnabledArraySetElementFastPath
                        (&scriptContext->optimizationOverrides);
      if (bVar3) {
        this = (JavascriptArray *)VarTo<Js::JavascriptNativeIntArray>(instance);
        BVar4 = JavascriptArray::TryGrowHeadSegmentAndSetItem<int,Js::JavascriptNativeIntArray>
                          (this,indexInt,iValue);
        if (BVar4 == 0) {
          JavascriptNativeIntArray::SetItem((JavascriptNativeIntArray *)this,indexInt,iValue);
        }
        goto LAB_00ab0647;
      }
    }
  }
  OP_SetElementI(instance,aElementIndex,(Var)((ulong)(uint)iValue | 0x1000000000000),scriptContext,
                 flags);
LAB_00ab0647:
  return (uint)(lVar1 != *instance);
}

Assistant:

BOOL JavascriptOperators::OP_SetNativeIntElementI(
        Var instance,
        Var aElementIndex,
        int32 iValue,
        ScriptContext* scriptContext,
        PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetNativeIntElementI);

        INT_PTR vt = (INT_PTR)nullptr;
        vt = VirtualTableInfoBase::GetVirtualTable(instance);

        if (TaggedInt::Is(aElementIndex))
        {
            int32 indexInt = TaggedInt::ToInt32(aElementIndex);
            if (indexInt >= 0 && scriptContext->optimizationOverrides.IsEnabledArraySetElementFastPath())
            {
                JavascriptNativeIntArray *arr = VarTo<JavascriptNativeIntArray>(instance);
                if (!(arr->TryGrowHeadSegmentAndSetItem<int32, JavascriptNativeIntArray>((uint32)indexInt, iValue)))
                {
                    arr->SetItem(indexInt, iValue);
                }
                return vt != VirtualTableInfoBase::GetVirtualTable(instance);
            }
        }

        JavascriptOperators::OP_SetElementI(instance, aElementIndex, JavascriptNumber::ToVar(iValue, scriptContext), scriptContext, flags);
        return vt != VirtualTableInfoBase::GetVirtualTable(instance);
        JIT_HELPER_END(Op_SetNativeIntElementI);
    }